

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution_x86::forward_int8_x86
          (Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  size_t __size;
  float fVar1;
  int iVar2;
  int *piVar3;
  _func_int **pp_Var4;
  ulong uVar5;
  Layer *pLVar6;
  undefined8 uVar7;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar22;
  void *pvVar23;
  undefined1 auVar24 [16];
  int iVar25;
  float *pfVar26;
  long lVar27;
  Convolution *this_00;
  int iVar28;
  _func_int *p_Var29;
  int iVar30;
  long lVar31;
  bool bVar32;
  float fVar33;
  Mat top_blob_tm;
  void *ptr;
  undefined8 uStack_1a0;
  undefined4 uStack_198;
  undefined4 uStack_194;
  int local_190;
  undefined4 uStack_18c;
  Allocator *local_188;
  undefined8 local_180;
  undefined8 uStack_178;
  size_t local_170;
  int local_160;
  int local_15c;
  Mat top_blob_g;
  vector<float,_std::allocator<float>_> local_118;
  vector<float,_std::allocator<float>_> local_100;
  Mat bottom_blob_bordered;
  Option opt_g_1;
  undefined1 local_78 [56];
  size_t local_40;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined3 uVar10;
  undefined1 uVar11;
  undefined2 uVar12;
  undefined1 uVar13;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined3 uVar18;
  undefined1 uVar19;
  undefined2 uVar20;
  undefined1 uVar21;
  
  this_00 = (Convolution *)
            ((long)&this->_vptr_Convolution_x86 + (long)this->_vptr_Convolution_x86[-3]);
  iVar25 = *(int *)(this->_vptr_Convolution_x86[-3] + 4 +
                   (long)&(this->weight_3x3_winograd23_data_int8).data);
  if ((1 < iVar25) || (iVar30 = this_00->dilation_h, 1 < iVar30)) {
    iVar25 = Convolution::forward(this_00,bottom_blob,top_blob,opt);
    return iVar25;
  }
  local_78._16_8_ = bottom_blob->elemsize;
  iVar28 = this_00->kernel_w;
  iVar2 = this_00->kernel_h;
  local_78._0_8_ = bottom_blob->data;
  piVar3 = bottom_blob->refcount;
  local_78._8_4_ = SUB84(piVar3,0);
  local_78._12_4_ = (undefined4)((ulong)piVar3 >> 0x20);
  local_78._24_4_ = bottom_blob->elempack;
  local_78._32_8_ = bottom_blob->allocator;
  local_78._40_4_ = bottom_blob->dims;
  local_78._44_4_ = bottom_blob->w;
  local_78._48_4_ = bottom_blob->h;
  local_78._52_4_ = bottom_blob->c;
  local_40 = bottom_blob->cstep;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
  }
  if (local_78._16_8_ != 1) {
    bottom_blob_bordered.allocator = *(Allocator **)&opt->use_int8_arithmetic;
    bottom_blob_bordered.data = *(void **)opt;
    uVar7._0_1_ = opt->use_winograd_convolution;
    uVar7._1_1_ = opt->use_sgemm_convolution;
    uVar7._2_1_ = opt->use_int8_inference;
    uVar7._3_1_ = opt->use_vulkan_compute;
    uVar8 = opt->use_fp16_packed;
    uVar9 = opt->use_fp16_storage;
    uVar11 = opt->use_fp16_arithmetic;
    uVar13 = opt->use_int8_storage;
    uVar12 = CONCAT11(uVar13,uVar11);
    uVar10 = CONCAT21(uVar12,uVar9);
    uVar7._4_4_ = CONCAT31(uVar10,uVar8);
    bottom_blob_bordered.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
    bottom_blob_bordered.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    bottom_blob_bordered.elempack = (int)uVar7;
    bottom_blob_bordered.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
    bottom_blob_bordered.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    bottom_blob_bordered._28_4_ = uVar7._4_4_;
    quantize_float32_to_int8
              (bottom_blob,(Mat *)local_78,
               *(float *)(&this->field_0x1f8 + (long)this->_vptr_Convolution_x86[-3]),
               (Option *)&bottom_blob_bordered);
  }
  bottom_blob_bordered.elemsize._0_4_ = 0;
  bottom_blob_bordered.elemsize._4_4_ = 0;
  bottom_blob_bordered.elempack = 0;
  bottom_blob_bordered.data = (void *)0x0;
  bottom_blob_bordered.refcount._0_4_ = 0;
  bottom_blob_bordered.refcount._4_4_ = 0;
  bottom_blob_bordered.allocator = (Allocator *)0x0;
  bottom_blob_bordered.dims = 0;
  bottom_blob_bordered.w = 0;
  bottom_blob_bordered.h = 0;
  bottom_blob_bordered.c = 0;
  bottom_blob_bordered.cstep = 0;
  Convolution::make_padding
            ((Convolution *)
             ((long)&this->_vptr_Convolution_x86 + (long)this->_vptr_Convolution_x86[-3]),
             (Mat *)local_78,&bottom_blob_bordered,opt);
  if ((bottom_blob_bordered.data == (void *)0x0) ||
     ((long)bottom_blob_bordered.c * bottom_blob_bordered.cstep == 0)) {
    iVar25 = -100;
  }
  else {
    p_Var29 = this->_vptr_Convolution_x86[-3];
    iVar28 = (~((iVar28 + -1) * iVar25) + bottom_blob_bordered.w) /
             *(int *)(p_Var29 + 0xc + (long)&(this->weight_3x3_winograd23_data_int8).data) + 1;
    iVar30 = (~((iVar2 + -1) * iVar30) + bottom_blob_bordered.h) /
             *(int *)(p_Var29 + 0x10 + (long)&(this->weight_3x3_winograd23_data_int8).data) + 1;
    Mat::create(top_blob,iVar28,iVar30,*(int *)(&this->use_winograd3x3_int8 + (long)p_Var29),
                ((ulong)(byte)(&this->field_0x200)[(long)p_Var29] ^ 1) * 3 + 1,opt->blob_allocator);
    iVar25 = -100;
    top_blob_tm.refcount = (int *)CONCAT44(top_blob_tm.refcount._4_4_,top_blob_tm.refcount._0_4_);
    uStack_1a0 = (float *)CONCAT44(uStack_1a0._4_4_,(undefined4)uStack_1a0);
    if ((top_blob->data != (void *)0x0) &&
       (top_blob_tm.refcount =
             (int *)CONCAT44(top_blob_tm.refcount._4_4_,top_blob_tm.refcount._0_4_),
       uStack_1a0 = (float *)CONCAT44(uStack_1a0._4_4_,(undefined4)uStack_1a0),
       (long)top_blob->c * top_blob->cstep != 0)) {
      p_Var29 = this->_vptr_Convolution_x86[-3];
      if ((&this->field_0x200)[(long)p_Var29] == '\x01') {
        top_blob_tm.c =
             *(int *)(&this->use_winograd3x3_int8 + (long)this->_vptr_Convolution_x86[-3]);
        top_blob_tm.allocator = opt->workspace_allocator;
        auVar24._4_4_ = -(uint)(iVar30 == 0);
        auVar24._0_4_ = -(uint)(iVar28 == 0);
        auVar24._8_4_ = -(uint)(top_blob_tm.c == 0);
        auVar24._12_4_ = 0;
        movmskps((int)p_Var29,auVar24 << 0x20);
        top_blob_tm.data = (void *)0x0;
        top_blob_tm.refcount._0_4_ = 0;
        top_blob_tm.refcount._4_4_ = 0;
        top_blob_tm.refcount = (int *)0x0;
        top_blob_tm.elemsize._0_4_ = 4;
        top_blob_tm.elemsize._4_4_ = 0;
        top_blob_tm.elempack = 1;
        top_blob_tm.w = iVar28;
        top_blob_tm.dims = 3;
        top_blob_tm.h = iVar30;
        top_blob_tm.cstep = (long)(iVar30 * iVar28) + 3U & 0x3ffffffffffffffc;
        lVar27 = top_blob_tm.cstep * (long)top_blob_tm.c;
        if (lVar27 != 0) {
          __size = lVar27 * 4 + 4;
          if (top_blob_tm.allocator == (Allocator *)0x0) {
            ptr._0_4_ = 0.0;
            ptr._4_4_ = 0;
            iVar30 = posix_memalign(&ptr,0x10,__size);
            if (iVar30 != 0) {
              ptr._0_4_ = 0.0;
              ptr._4_4_ = 0;
            }
            top_blob_tm.data = (void *)CONCAT44(ptr._4_4_,ptr._0_4_);
          }
          else {
            top_blob_tm.data =
                 (void *)(**(code **)(*(long *)top_blob_tm.allocator + 0x10))
                                   (top_blob_tm.allocator,__size);
          }
          top_blob_tm.refcount = (int *)((long)top_blob_tm.data + lVar27 * 4);
          *(undefined4 *)((long)top_blob_tm.data + lVar27 * 4) = 1;
        }
        if (top_blob_tm.data == (void *)0x0) {
          bVar32 = true;
        }
        else {
          bVar32 = (long)top_blob_tm.c * top_blob_tm.cstep == 0;
        }
        if (bVar32) {
          Mat::~Mat(&top_blob_tm);
          goto LAB_0013e3b5;
        }
        if (this->use_winograd3x3_int8 == true) {
          conv3x3s1_winograd23_int8_sse
                    (&bottom_blob_bordered,&top_blob_tm,&this->weight_3x3_winograd23_data_int8,opt);
          pp_Var4 = this->_vptr_Convolution_x86;
          if (0 < *(int *)(&this->use_winograd3x3_int8 + (long)pp_Var4[-3])) {
            lVar31 = 0;
            lVar27 = 0;
            do {
              uVar22._0_1_ = opt->lightmode;
              uVar22._1_3_ = *(undefined3 *)&opt->field_0x1;
              uVar22._4_4_ = opt->num_threads;
              opt_g_1.workspace_allocator = opt->workspace_allocator;
              opt_g_1.use_winograd_convolution = opt->use_winograd_convolution;
              opt_g_1.use_sgemm_convolution = opt->use_sgemm_convolution;
              opt_g_1.use_int8_inference = opt->use_int8_inference;
              opt_g_1.use_vulkan_compute = opt->use_vulkan_compute;
              opt_g_1.use_fp16_packed = opt->use_fp16_packed;
              opt_g_1.use_fp16_storage = opt->use_fp16_storage;
              opt_g_1.use_fp16_arithmetic = opt->use_fp16_arithmetic;
              opt_g_1.use_int8_storage = opt->use_int8_storage;
              opt_g_1.use_int8_arithmetic = opt->use_int8_arithmetic;
              opt_g_1.use_packing_layout = opt->use_packing_layout;
              opt_g_1.use_shader_pack8 = opt->use_shader_pack8;
              opt_g_1.use_image_storage = opt->use_image_storage;
              opt_g_1.use_bf16_storage = opt->use_bf16_storage;
              opt_g_1._37_3_ = *(undefined3 *)&opt->field_0x25;
              opt_g_1._0_4_ = SUB84(uVar22,0);
              opt_g_1.num_threads = 1;
              top_blob_g.allocator = top_blob->allocator;
              local_170 = CONCAT44(top_blob_tm.elemsize._4_4_,(undefined4)top_blob_tm.elemsize);
              ptr = (void *)(top_blob_tm.cstep * lVar27 * local_170 + (long)top_blob_tm.data);
              uStack_1a0._0_4_ = 0;
              uStack_1a0._4_4_ = 0;
              uStack_198 = (undefined4)top_blob_tm.elemsize;
              uStack_194 = top_blob_tm.elemsize._4_4_;
              local_190 = top_blob_tm.elempack;
              local_188 = top_blob_tm.allocator;
              local_180._4_4_ = top_blob_tm.w;
              local_180._0_4_ = 3;
              uStack_178._4_4_ = 1;
              uStack_178._0_4_ = top_blob_tm.h;
              local_170 = ((long)(top_blob_tm.h * top_blob_tm.w) * local_170 + 0xf &
                          0xfffffffffffffff0) / local_170;
              uVar5 = top_blob->elemsize;
              top_blob_g.data = (void *)(top_blob->cstep * lVar27 * uVar5 + (long)top_blob->data);
              top_blob_g.elempack = top_blob->elempack;
              top_blob_g.refcount._0_4_ = 0;
              top_blob_g.refcount._4_4_ = 0;
              top_blob_g.elemsize._0_4_ = (undefined4)uVar5;
              top_blob_g.elemsize._4_4_ = (undefined4)(uVar5 >> 0x20);
              top_blob_g.w = top_blob->w;
              top_blob_g.dims = 3;
              top_blob_g.c = 1;
              top_blob_g.h = top_blob->h;
              top_blob_g.cstep =
                   ((long)(top_blob->h * top_blob->w) * uVar5 + 0xf & 0xfffffffffffffff0) / uVar5;
              p_Var29 = pp_Var4[-3];
              fVar1 = *(float *)(*(long *)(&this->field_0x1b8 + (long)p_Var29) + lVar31);
              fVar33 = 0.0;
              if (fVar1 != 0.0) {
                fVar33 = 1.0 / (fVar1 * *(float *)(&this->field_0x1f8 + (long)p_Var29));
              }
              if (*(int *)(p_Var29 + 0x28 + (long)&(this->weight_3x3_winograd23_data_int8).data) ==
                  0) {
                pfVar26 = (float *)0x0;
              }
              else {
                pfVar26 = (float *)(*(long *)(&this->field_0x178 + (long)p_Var29) + lVar31);
              }
              opt_g_1.blob_allocator = top_blob_g.allocator;
              requantize_int8_to_int8
                        ((Mat *)&ptr,&top_blob_g,fVar33,
                         *(float *)(&this->field_0x1fc + (long)p_Var29),pfVar26,
                         (uint)(*(int *)(p_Var29 + 0x28 +
                                        (long)&(this->weight_3x3_winograd23_data_int8).data) != 0),0
                         ,&opt_g_1);
              piVar3 = (int *)CONCAT44(top_blob_g.refcount._4_4_,top_blob_g.refcount._0_4_);
              if (piVar3 != (int *)0x0) {
                LOCK();
                *piVar3 = *piVar3 + -1;
                UNLOCK();
                if (*piVar3 == 0) {
                  if (top_blob_g.allocator == (Allocator *)0x0) {
                    if (top_blob_g.data != (void *)0x0) {
                      free(top_blob_g.data);
                    }
                  }
                  else {
                    (**(code **)(*(long *)top_blob_g.allocator + 0x18))();
                  }
                }
              }
              top_blob_g.elemsize._0_4_ = 0;
              top_blob_g.elemsize._4_4_ = 0;
              top_blob_g.elempack = 0;
              top_blob_g.data = (void *)0x0;
              top_blob_g.refcount._0_4_ = 0;
              top_blob_g.refcount._4_4_ = 0;
              top_blob_g.dims = 0;
              top_blob_g.w = 0;
              top_blob_g.h = 0;
              top_blob_g.c = 0;
              top_blob_g.cstep = 0;
              piVar3 = (int *)CONCAT44(uStack_1a0._4_4_,(undefined4)uStack_1a0);
              if (piVar3 != (int *)0x0) {
                LOCK();
                *piVar3 = *piVar3 + -1;
                UNLOCK();
                if (*piVar3 == 0) {
                  if (local_188 == (Allocator *)0x0) {
                    if (ptr != (void *)0x0) {
                      free(ptr);
                    }
                  }
                  else {
                    (**(code **)(*(long *)local_188 + 0x18))();
                  }
                }
              }
              uStack_198 = 0;
              uStack_194 = 0;
              local_190 = 0;
              ptr._0_4_ = 0.0;
              ptr._4_4_ = 0;
              uStack_1a0 = (float *)0x0;
              local_180._0_4_ = 0;
              local_180._4_4_ = 0;
              uStack_178._0_4_ = 0;
              uStack_178._4_4_ = 0;
              local_170 = 0;
              lVar27 = lVar27 + 1;
              pp_Var4 = this->_vptr_Convolution_x86;
              lVar31 = lVar31 + 4;
            } while (lVar27 < *(int *)(&this->use_winograd3x3_int8 + (long)pp_Var4[-3]));
          }
        }
        else {
          ptr._0_4_ = 0.0;
          ptr._4_4_ = 0;
          uStack_1a0 = (float *)0x0;
          uStack_198 = 0;
          uStack_194 = 0;
          p_Var29 = (_func_int *)
                    ((long)&this->_vptr_Convolution_x86 + (long)this->_vptr_Convolution_x86[-3]);
          if (0 < *(int *)(&this->use_winograd3x3_int8 + (long)this->_vptr_Convolution_x86[-3])) {
            lVar27 = 0;
            uStack_1a0 = (float *)0x0;
            do {
              fVar1 = *(float *)(*(long *)(p_Var29 + 0x1b8) + lVar27 * 4);
              fVar33 = 0.0;
              if (fVar1 != 0.0) {
                fVar33 = 1.0 / (fVar1 * *(float *)(p_Var29 + 0x1f8));
              }
              top_blob_g.data = (void *)CONCAT44(top_blob_g.data._4_4_,fVar33);
              opt_g_1._0_4_ = *(undefined4 *)(p_Var29 + 0x1fc);
              if (uStack_1a0 == (float *)CONCAT44(uStack_194,uStack_198)) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)&ptr,uStack_1a0,
                           (float *)&top_blob_g);
              }
              else {
                *uStack_1a0 = fVar33;
                uStack_1a0 = uStack_1a0 + 1;
              }
              if (uStack_1a0 == (float *)CONCAT44(uStack_194,uStack_198)) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)&ptr,uStack_1a0,(float *)&opt_g_1)
                ;
              }
              else {
                *uStack_1a0 = (float)opt_g_1._0_4_;
                uStack_1a0 = uStack_1a0 + 1;
              }
              lVar27 = lVar27 + 1;
              p_Var29 = (_func_int *)
                        ((long)&this->_vptr_Convolution_x86 + (long)this->_vptr_Convolution_x86[-3])
              ;
            } while (lVar27 < *(int *)(&this->use_winograd3x3_int8 +
                                      (long)this->_vptr_Convolution_x86[-3]));
          }
          iVar30 = *(int *)(p_Var29 + 0xbc);
          local_15c = *(int *)(p_Var29 + 0xc0);
          local_160 = *(int *)(p_Var29 + 0xcc);
          iVar28 = *(int *)(p_Var29 + 0xd0);
          std::vector<float,_std::allocator<float>_>::vector
                    (&local_100,(vector<float,_std::allocator<float>_> *)&ptr);
          conv_im2col_sgemm_int8_requant_sse
                    (&bottom_blob_bordered,top_blob,(Mat *)(p_Var29 + 0x138),iVar30,local_15c,
                     local_160,iVar28,(Mat *)(p_Var29 + 0x178),&local_100,opt);
          if (local_100.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_100.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_100.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_100.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          pvVar23 = (void *)CONCAT44(ptr._4_4_,ptr._0_4_);
          if (pvVar23 != (void *)0x0) {
            operator_delete(pvVar23,CONCAT44(uStack_194,uStack_198) - (long)pvVar23);
          }
        }
        Mat::~Mat(&top_blob_tm);
        if (bVar32) goto LAB_0013e3b5;
      }
      else if (this->use_winograd3x3_int8 == true) {
        conv3x3s1_winograd23_int8_sse
                  (&bottom_blob_bordered,top_blob,&this->weight_3x3_winograd23_data_int8,opt);
        pp_Var4 = this->_vptr_Convolution_x86;
        if (0 < *(int *)(&this->use_winograd3x3_int8 + (long)pp_Var4[-3])) {
          lVar31 = 0;
          lVar27 = 0;
          do {
            uVar14._0_1_ = opt->lightmode;
            uVar14._1_3_ = *(undefined3 *)&opt->field_0x1;
            uVar14._4_4_ = opt->num_threads;
            uVar15._0_1_ = opt->use_winograd_convolution;
            uVar15._1_1_ = opt->use_sgemm_convolution;
            uVar15._2_1_ = opt->use_int8_inference;
            uVar15._3_1_ = opt->use_vulkan_compute;
            uVar16 = opt->use_fp16_packed;
            uVar17 = opt->use_fp16_storage;
            uVar19 = opt->use_fp16_arithmetic;
            uVar21 = opt->use_int8_storage;
            uVar20 = CONCAT11(uVar21,uVar19);
            uVar18 = CONCAT21(uVar20,uVar17);
            uVar15._4_4_ = CONCAT31(uVar18,uVar16);
            ptr._0_4_ = (float)uVar14;
            local_188 = *(Allocator **)&opt->use_int8_arithmetic;
            uStack_198 = SUB84(opt->workspace_allocator,0);
            uStack_194 = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
            local_190 = (int)uVar15;
            ptr._4_4_ = 1;
            top_blob_tm.allocator = top_blob->allocator;
            uStack_1a0._0_4_ = SUB84(top_blob_tm.allocator,0);
            uStack_1a0._4_4_ = (undefined4)((ulong)top_blob_tm.allocator >> 0x20);
            uVar5 = top_blob->elemsize;
            top_blob_tm.data = (void *)(top_blob->cstep * lVar27 * uVar5 + (long)top_blob->data);
            top_blob_tm.elempack = top_blob->elempack;
            top_blob_tm.refcount._0_4_ = 0;
            top_blob_tm.refcount._4_4_ = 0;
            top_blob_tm.elemsize._0_4_ = (undefined4)uVar5;
            top_blob_tm.elemsize._4_4_ = (undefined4)(uVar5 >> 0x20);
            top_blob_tm.w = top_blob->w;
            top_blob_tm.dims = 3;
            top_blob_tm.h = top_blob->h;
            top_blob_tm.c = 1;
            top_blob_tm.cstep =
                 ((long)(top_blob->h * top_blob->w) * uVar5 + 0xf & 0xfffffffffffffff0) / uVar5;
            p_Var29 = pp_Var4[-3];
            fVar1 = *(float *)(*(long *)(&this->field_0x1b8 + (long)p_Var29) + lVar31);
            fVar33 = 0.0;
            if (fVar1 != 0.0) {
              fVar33 = 1.0 / (fVar1 * *(float *)(&this->field_0x1f8 + (long)p_Var29));
            }
            if (*(int *)(p_Var29 + 0x28 + (long)&(this->weight_3x3_winograd23_data_int8).data) == 0)
            {
              pfVar26 = (float *)0x0;
            }
            else {
              pfVar26 = (float *)(*(long *)(&this->field_0x178 + (long)p_Var29) + lVar31);
            }
            uStack_18c = uVar15._4_4_;
            dequantize_int32_to_float32
                      (&top_blob_tm,fVar33,pfVar26,
                       (uint)(*(int *)(p_Var29 + 0x28 +
                                      (long)&(this->weight_3x3_winograd23_data_int8).data) != 0),
                       (Option *)&ptr);
            piVar3 = (int *)CONCAT44(top_blob_tm.refcount._4_4_,top_blob_tm.refcount._0_4_);
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (top_blob_tm.allocator == (Allocator *)0x0) {
                  if (top_blob_tm.data != (void *)0x0) {
                    free(top_blob_tm.data);
                  }
                }
                else {
                  (**(code **)(*(long *)top_blob_tm.allocator + 0x18))();
                }
              }
            }
            top_blob_tm.elemsize._0_4_ = 0;
            top_blob_tm.elemsize._4_4_ = 0;
            top_blob_tm.elempack = 0;
            top_blob_tm.data = (void *)0x0;
            top_blob_tm.refcount = (int *)0x0;
            top_blob_tm._40_16_ = ZEXT816(0);
            top_blob_tm.cstep = 0;
            lVar27 = lVar27 + 1;
            pp_Var4 = this->_vptr_Convolution_x86;
            lVar31 = lVar31 + 4;
          } while (lVar27 < *(int *)(&this->use_winograd3x3_int8 + (long)pp_Var4[-3]));
        }
      }
      else {
        top_blob_tm.data = (void *)0x0;
        top_blob_tm.refcount = (int *)0x0;
        top_blob_tm.elemsize._0_4_ = 0;
        top_blob_tm.elemsize._4_4_ = 0;
        p_Var29 = (_func_int *)
                  ((long)&this->_vptr_Convolution_x86 + (long)this->_vptr_Convolution_x86[-3]);
        if (0 < *(int *)(&this->use_winograd3x3_int8 + (long)this->_vptr_Convolution_x86[-3])) {
          lVar27 = 0;
          top_blob_tm.refcount = (int *)(float *)0x0;
          do {
            fVar1 = *(float *)(*(long *)(p_Var29 + 0x1b8) + lVar27 * 4);
            ptr._0_4_ = 0.0;
            if (fVar1 != 0.0) {
              ptr._0_4_ = 1.0 / (fVar1 * *(float *)(p_Var29 + 0x1f8));
            }
            if ((float *)top_blob_tm.refcount ==
                (float *)CONCAT44(top_blob_tm.elemsize._4_4_,(undefined4)top_blob_tm.elemsize)) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)&top_blob_tm,
                         (iterator)top_blob_tm.refcount,(float *)&ptr);
            }
            else {
              *top_blob_tm.refcount = (int)ptr._0_4_;
              top_blob_tm.refcount = (int *)((float *)top_blob_tm.refcount + 1);
            }
            lVar27 = lVar27 + 1;
            p_Var29 = (_func_int *)
                      ((long)&this->_vptr_Convolution_x86 + (long)this->_vptr_Convolution_x86[-3]);
          } while (lVar27 < *(int *)(&this->use_winograd3x3_int8 +
                                    (long)this->_vptr_Convolution_x86[-3]));
        }
        iVar25 = *(int *)(p_Var29 + 0xbc);
        iVar30 = *(int *)(p_Var29 + 0xc0);
        iVar28 = *(int *)(p_Var29 + 0xcc);
        iVar2 = *(int *)(p_Var29 + 0xd0);
        std::vector<float,_std::allocator<float>_>::vector
                  (&local_118,(vector<float,_std::allocator<float>_> *)&top_blob_tm);
        conv_im2col_sgemm_int8_dequant_sse
                  (&bottom_blob_bordered,top_blob,(Mat *)(p_Var29 + 0x138),iVar25,iVar30,iVar28,
                   iVar2,(Mat *)(p_Var29 + 0x178),&local_118,opt);
        if (local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (top_blob_tm.data != (void *)0x0) {
          operator_delete(top_blob_tm.data,
                          CONCAT44(top_blob_tm.elemsize._4_4_,(undefined4)top_blob_tm.elemsize) -
                          (long)top_blob_tm.data);
        }
      }
      pLVar6 = this->activation;
      iVar25 = 0;
      if (pLVar6 != (Layer *)0x0) {
        (*pLVar6->_vptr_Layer[9])(pLVar6,top_blob,opt);
      }
    }
  }
LAB_0013e3b5:
  piVar3 = (int *)CONCAT44(bottom_blob_bordered.refcount._4_4_,bottom_blob_bordered.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (bottom_blob_bordered.allocator == (Allocator *)0x0) {
        if (bottom_blob_bordered.data != (void *)0x0) {
          free(bottom_blob_bordered.data);
        }
      }
      else {
        (**(code **)(*(long *)bottom_blob_bordered.allocator + 0x18))();
      }
    }
  }
  piVar3 = (int *)CONCAT44(local_78._12_4_,local_78._8_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if ((Allocator *)local_78._32_8_ == (Allocator *)0x0) {
        if ((void *)local_78._0_8_ != (void *)0x0) {
          free((void *)local_78._0_8_);
        }
      }
      else {
        (**(code **)(*(long *)local_78._32_8_ + 0x18))();
      }
    }
  }
  return iVar25;
}

Assistant:

int Convolution_x86::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (dilation_w > 1 || dilation_h > 1)
    {
        return Convolution::forward(bottom_blob, top_blob, opt);
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_unbordered = bottom_blob;
    if (elemsize != 1)
    {
        Option opt_g = opt;
        opt_g.blob_allocator = opt.workspace_allocator;

        quantize_float32_to_int8(bottom_blob, bottom_blob_unbordered, bottom_blob_int8_scale, opt_g);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_unbordered, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // int8
    size_t out_elemsize = use_int8_requantize ? 1u : 4u;

    top_blob.create(outw, outh, num_output, out_elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // int8
    if (use_int8_requantize)
    {
        Mat top_blob_tm;
        top_blob_tm.create(outw, outh, num_output, (size_t)4u, opt.workspace_allocator);
        if (top_blob_tm.empty())
            return -100;

        if (use_winograd3x3_int8)
        {
            conv3x3s1_winograd23_int8_sse(bottom_blob_bordered, top_blob_tm, weight_3x3_winograd23_data_int8, opt);
//             conv3x3s1_winograd43_int8_sse(bottom_blob_bordered, top_blob_tm, weight_3x3_winograd23_data_int8, opt);

            // requantize, reverse scale inplace
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p=0; p<num_output; p++)
            {
                Option opt_g = opt;
                opt_g.num_threads = 1;
                opt_g.blob_allocator = top_blob.allocator;

                Mat top_blob_tm_g = top_blob_tm.channel_range(p, 1);
                Mat top_blob_g = top_blob.channel_range(p, 1);

                // requantize and relu
                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scale * weight_data_int8_scales[p]);

                float scale_out = top_blob_int8_scale;//FIXME load param

                requantize_int8_to_int8(top_blob_tm_g, top_blob_g, scale_in, scale_out, bias_term ? (const float*)bias_data + p : 0, bias_term ? 1 : 0, 0, opt_g);
            }
        }
        else
        {
            std::vector<float> requantize_scales;
            for (int p=0; p<num_output; p++)
            {
                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scale * weight_data_int8_scales[p]);

                float scale_out = top_blob_int8_scale;

                requantize_scales.push_back(scale_in);
                requantize_scales.push_back(scale_out);
            }

            conv_im2col_sgemm_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data, kernel_w, kernel_h, stride_w, stride_h, bias_data, requantize_scales, opt);
        }
    }
    else
    {
        if (use_winograd3x3_int8)
        {
            conv3x3s1_winograd23_int8_sse(bottom_blob_bordered, top_blob, weight_3x3_winograd23_data_int8, opt);
//             conv3x3s1_winograd43_int8_sse(bottom_blob_bordered, top_blob, weight_3x3_winograd23_data_int8, opt);

            // dequantize, reverse scale inplace
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p=0; p<num_output; p++)
            {
                Option opt_g = opt;
                opt_g.num_threads = 1;
                opt_g.blob_allocator = top_blob.allocator;

                Mat top_blob_g = top_blob.channel_range(p, 1);

                // dequantize
                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scale * weight_data_int8_scales[p]);

                dequantize_int32_to_float32(top_blob_g, scale_in, bias_term ? (const float*)bias_data + p : 0, bias_term ? 1 : 0, opt_g);
            }
        }
        else
        {
            std::vector<float> dequantize_scales;
            for (int p=0; p<num_output; p++)
            {
                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scale * weight_data_int8_scales[p]);

                dequantize_scales.push_back(scale_in);
            }

            conv_im2col_sgemm_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data, kernel_w, kernel_h, stride_w, stride_h, bias_data, dequantize_scales, opt);
        }
    }

    if (activation)
    {
        activation->forward_inplace(top_blob, opt);
    }

    return 0;
}